

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  uint value;
  uint32_or_64_or_128_t<unsigned_int> n;
  scoped_padder p;
  scoped_padder local_60;
  char local_38 [21];
  char local_23 [3];
  char *local_20;
  
  value = getpid();
  uVar1 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  scoped_padder::scoped_padder
            (&local_60,
             (ulong)value +
             *(long *)(::fmt::v11::detail::do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8)
             >> 0x20,&(this->super_flag_formatter).padinfo_,dest);
  local_20 = ::fmt::v11::detail::do_format_decimal<char,unsigned_int>(local_38,value,0x15);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  scoped_padder::~scoped_padder(&local_60);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }